

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary_unix.cpp
# Opt level: O0

bool __thiscall QLibraryPrivate::load_sys(QLibraryPrivate *this)

{
  QByteArrayView ba;
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  qsizetype qVar4;
  char **in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_const_QString_&> QVar5;
  QStringBuilder<QString_&,_const_QString_&> QVar6;
  qsizetype lparen;
  int suffix;
  int prefix;
  Handle hnd;
  bool retry;
  int dlFlags;
  anon_class_1_0_00000001 transform;
  LoadHints loadHints;
  QStringList prefixes;
  QStringList suffixes;
  QString name;
  QString path;
  QString attempt;
  QFileSystemEntry fsEntry;
  QMutexLocker<QMutex> locker;
  undefined4 in_stack_fffffffffffffbe8;
  CaseSensitivity in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  CaseSensitivity in_stack_fffffffffffffbf4;
  undefined4 uVar7;
  QFileSystemEntry *in_stack_fffffffffffffbf8;
  undefined6 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc06;
  undefined1 in_stack_fffffffffffffc07;
  QString *in_stack_fffffffffffffc08;
  QString *in_stack_fffffffffffffc10;
  QString *in_stack_fffffffffffffc18;
  QString *in_stack_fffffffffffffc30;
  _func_void_QString_ptr *in_stack_fffffffffffffc38;
  QStringList *in_stack_fffffffffffffc40;
  anon_class_1_0_00000001 *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  storage_type *in_stack_fffffffffffffc78;
  byte local_331;
  int local_318;
  int local_314;
  long local_310;
  uint local_300;
  QChar local_282 [13];
  QStringBuilder<QString_&,_const_QString_&> local_268;
  QStringBuilder<QString_&,_const_QString_&> local_208;
  QChar local_1c6;
  QFlagsStorageHelper<QLibrary::LoadHint,_4> local_1c4;
  QChar local_1be;
  __2 local_1bb;
  __1 local_1ba;
  undefined1 local_1b9;
  QFlagsStorageHelper<QLibrary::LoadHint,_4> local_154;
  QFlagsStorageHelper<QLibrary::LoadHint,_4> local_150;
  QFlagsStorageHelper<QLibrary::LoadHint,_4> local_14c;
  QFlagsStorageHelper<QLibrary::LoadHint,_4> local_148;
  QFlagsStorageHelper<QLibrary::LoadHint,_4> local_144;
  QStringView local_128;
  QList<QString> local_100;
  QList<QString> local_e8;
  QChar local_ca;
  QLatin1StringView local_c8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QString local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (QMutex *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x8cce9a);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::path(in_stack_fffffffffffffbf8);
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::fileName(in_stack_fffffffffffffbf8);
  local_c8 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffbf8,
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  bVar1 = ::operator==(&in_stack_fffffffffffffbf8->m_filePath,
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  local_331 = 0;
  if (bVar1) {
    bVar1 = QString::startsWith(&in_stack_fffffffffffffbf8->m_filePath,
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                in_stack_fffffffffffffbec);
    local_331 = bVar1 ^ 0xff;
  }
  if ((local_331 & 1) == 0) {
    QChar::QChar<char16_t,_true>(&local_ca,L'/');
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                        (QChar)(char16_t)((ulong)in_stack_fffffffffffffbf8 >> 0x30));
  }
  else {
    QString::clear((QString *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  }
  local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x8cd0c8);
  local_100.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_100.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_100.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x8cd102);
  if (*(int *)((long)in_RDI + 0xac) != 0) {
    local_128 = prefix_sys();
    QStringView::toString
              ((QStringView *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    QList<QString>::operator<<
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QString::~QString((QString *)0x8cd189);
    suffixes_sys(in_stack_fffffffffffffc30);
    QList<QString>::operator=
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (QList<QString> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QList<QString>::~QList((QList<QString> *)0x8cd1c6);
  }
  local_144.super_QFlagsStorage<QLibrary::LoadHint>.i =
       (QFlagsStorage<QLibrary::LoadHint>)0xaaaaaaaa;
  local_144.super_QFlagsStorage<QLibrary::LoadHint>.i =
       (QFlagsStorage<QLibrary::LoadHint>)
       QLibraryPrivate::loadHints
                 ((QLibraryPrivate *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  local_148.super_QFlagsStorage<QLibrary::LoadHint>.i =
       (QFlagsStorage<QLibrary::LoadHint>)
       QFlags<QLibrary::LoadHint>::operator&
                 ((QFlags<QLibrary::LoadHint> *)
                  CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                  in_stack_fffffffffffffbec);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_148);
  if (bVar1) {
    local_300 = 2;
  }
  else {
    local_300 = 1;
  }
  local_14c.super_QFlagsStorage<QLibrary::LoadHint>.i =
       (QFlagsStorage<QLibrary::LoadHint>)
       QFlags<QLibrary::LoadHint>::operator&
                 ((QFlags<QLibrary::LoadHint> *)
                  CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                  in_stack_fffffffffffffbec);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14c);
  if (bVar1) {
    local_300 = local_300 | 0x100;
  }
  local_150.super_QFlagsStorage<QLibrary::LoadHint>.i =
       (QFlagsStorage<QLibrary::LoadHint>)
       QFlags<QLibrary::LoadHint>::operator&
                 ((QFlags<QLibrary::LoadHint> *)
                  CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                  in_stack_fffffffffffffbec);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_150);
  if (bVar1) {
    local_300 = local_300 | 8;
  }
  local_154.super_QFlagsStorage<QLibrary::LoadHint>.i =
       (QFlagsStorage<QLibrary::LoadHint>)
       QFlags<QLibrary::LoadHint>::operator&
                 ((QFlags<QLibrary::LoadHint> *)
                  CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                  in_stack_fffffffffffffbec);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_154);
  if (bVar1) {
    local_300 = local_300 | 0x1000;
  }
  bVar1 = QFileSystemEntry::isAbsolute
                    ((QFileSystemEntry *)
                     CONCAT17(in_stack_fffffffffffffc07,
                              CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)));
  if (bVar1) {
    QString::QString((QString *)0x8cd3a2);
    QList<QString>::prepend
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QString::~QString((QString *)0x8cd3c6);
    QString::QString((QString *)0x8cd3db);
    QList<QString>::prepend
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QString::~QString((QString *)0x8cd3ff);
  }
  else {
    QString::QString((QString *)0x8cd46d);
    QList<QString>::append
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QString::~QString((QString *)0x8cd491);
    QString::QString((QString *)0x8cd4a6);
    QList<QString>::append
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QString::~QString((QString *)0x8cd4ca);
  }
  uVar3 = qCpuFeatures();
  if ((uVar3 & 0x76ff) == 0x76ff) {
    local_1b9 = 0xaa;
    if (*(int *)((long)in_RDI + 0xac) == 0) {
      load_sys()::$_1::operator_cast_to_function_pointer(&local_1ba);
      load_sys::anon_class_1_0_00000001::operator()
                (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    }
    else {
      load_sys()::$_2::operator_cast_to_function_pointer(&local_1bb);
      load_sys::anon_class_1_0_00000001::operator()
                (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    }
  }
  QMutexLocker<QMutex>::unlock
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  QVar6.b = in_stack_fffffffffffffc10;
  QVar6.a = in_stack_fffffffffffffc18;
  bVar1 = true;
  local_310 = 0;
  local_314 = 0;
  do {
    bVar2 = false;
    if ((bVar1) && (bVar2 = false, local_310 == 0)) {
      in_stack_fffffffffffffc78 = (storage_type *)(long)local_314;
      qVar4 = QList<QString>::size(&local_100);
      bVar2 = (long)in_stack_fffffffffffffc78 < qVar4;
    }
    if (!bVar2) {
      QMutexLocker<QMutex>::relock
                ((QMutexLocker<QMutex> *)
                 CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      if (local_310 == 0) {
        QLibrary::tr((char *)in_stack_fffffffffffffbf8,
                     (char *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     in_stack_fffffffffffffbec);
        dlerror();
        QByteArrayView::QByteArrayView<char_*,_true>
                  ((QByteArrayView *)
                   CONCAT17(in_stack_fffffffffffffc07,
                            CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)),in_RDI);
        ba.m_size._7_1_ = in_stack_fffffffffffffc77;
        ba.m_size._0_7_ = in_stack_fffffffffffffc70;
        ba.m_data = in_stack_fffffffffffffc78;
        QString::fromLocal8Bit(ba);
        QString::arg<QString_const&,QString>(QVar6.a,QVar6.b,in_stack_fffffffffffffc08);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                           (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
        ;
        QString::~QString((QString *)0x8cdbe0);
        QString::~QString((QString *)0x8cdbed);
        QString::~QString((QString *)0x8cdbfa);
      }
      else {
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                           (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
        ;
        QString::clear((QString *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      }
      QBasicAtomicPointer<void>::storeRelaxed
                ((QBasicAtomicPointer<void> *)
                 CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (Type)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      uVar7 = CONCAT13(local_310 != 0,(int3)in_stack_fffffffffffffbf4);
      QList<QString>::~QList((QList<QString> *)0x8cdcc1);
      QList<QString>::~QList((QList<QString> *)0x8cdcce);
      QString::~QString((QString *)0x8cdcdb);
      QString::~QString((QString *)0x8cdce8);
      QFileSystemEntry::~QFileSystemEntry
                ((QFileSystemEntry *)CONCAT44(uVar7,in_stack_fffffffffffffbf0));
      QString::~QString((QString *)0x8cdd02);
      QMutexLocker<QMutex>::~QMutexLocker
                ((QMutexLocker<QMutex> *)CONCAT44(uVar7,in_stack_fffffffffffffbf0));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (bool)((byte)((uint)uVar7 >> 0x18) & 1);
      }
      __stack_chk_fail();
    }
    local_318 = 0;
    while( true ) {
      bVar2 = false;
      if ((bVar1) && (bVar2 = false, local_310 == 0)) {
        qVar4 = QList<QString>::size(&local_e8);
        bVar2 = local_318 < qVar4;
      }
      if (!bVar2) break;
      bVar2 = QString::isEmpty((QString *)0x8cd6d3);
      if (bVar2) {
        QList<QString>::at((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        QChar::QChar<char16_t,_true>(&local_1be,L'/');
        bVar2 = QString::contains((QString *)
                                  CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                  (QChar)(char16_t)((ulong)in_stack_fffffffffffffbf8 >> 0x30),
                                  in_stack_fffffffffffffbec);
        if (!bVar2) goto LAB_008cd731;
      }
      else {
LAB_008cd731:
        QList<QString>::at((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        bVar2 = QString::isEmpty((QString *)0x8cd74e);
        if (!bVar2) {
          QList<QString>::at((QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          bVar2 = QString::endsWith(&in_stack_fffffffffffffbf8->m_filePath,
                                    (QString *)
                                    CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                    in_stack_fffffffffffffbec);
          if (bVar2) goto LAB_008cdadf;
        }
        local_1c4.super_QFlagsStorage<QLibrary::LoadHint>.i =
             (QFlagsStorage<QLibrary::LoadHint>)
             QFlags<QLibrary::LoadHint>::operator&
                       ((QFlags<QLibrary::LoadHint> *)
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                        in_stack_fffffffffffffbec);
        bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c4);
        if (bVar2) {
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QChar::QChar<char16_t,_true>(&local_1c6,L'(');
          qVar4 = QString::indexOf(&in_stack_fffffffffffffbf8->m_filePath,(QChar)QVar6.a._6_2_,
                                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                   in_stack_fffffffffffffbec);
          if (qVar4 == -1) {
            QString::size(&local_78);
          }
          QList<QString>::at((QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QVar5 = ::operator+((QString *)
                              CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                              (QString *)
                              CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          local_208 = QVar5;
          QList<QString>::at((QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QString::insert(QVar6.b,(qsizetype)in_stack_fffffffffffffc08,
                          (QString *)
                          CONCAT17(in_stack_fffffffffffffc07,
                                   CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)));
          ::operator+((QStringBuilder<QString_&,_const_QString_&> *)
                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                      (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&> *)
                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QString::~QString((QString *)0x8cd919);
        }
        else {
          QList<QString>::at((QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QVar6 = ::operator+((QString *)
                              CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                              (QString *)
                              CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          local_268 = QVar6;
          ::operator+((QStringBuilder<QString_&,_const_QString_&> *)
                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                      (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QList<QString>::at((QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          ::operator+((QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&> *)
                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                      (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&>,_const_QString_&>
                      *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QString::~QString((QString *)0x8cd9f0);
        }
        QFile::encodeName((QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        in_stack_fffffffffffffc08 =
             (QString *)QByteArray::operator_cast_to_char_((QByteArray *)0x8cda14);
        local_310 = dlopen(in_stack_fffffffffffffc08,local_300);
        QByteArray::~QByteArray((QByteArray *)0x8cda41);
        if (local_310 == 0) {
          QChar::QChar<char16_t,_true>(local_282,L'/');
          in_stack_fffffffffffffc07 =
               QString::startsWith(&in_stack_fffffffffffffbf8->m_filePath,
                                   (QChar)(char16_t)((ulong)in_stack_fffffffffffffc08 >> 0x30),
                                   in_stack_fffffffffffffbf4);
          if ((bool)in_stack_fffffffffffffc07) {
            in_stack_fffffffffffffc06 = QFile::exists((QString *)0x8cda99);
            if ((bool)in_stack_fffffffffffffc06) {
              bVar1 = false;
            }
          }
        }
      }
LAB_008cdadf:
      local_318 = local_318 + 1;
    }
    local_314 = local_314 + 1;
    in_stack_fffffffffffffc77 = 0;
  } while( true );
}

Assistant:

bool QLibraryPrivate::load_sys()
{
#if defined(Q_OS_WASM) && defined(QT_STATIC)
    // emscripten does not support dlopen when using static linking
    return false;
#endif

    QMutexLocker locker(&mutex);
    QString attempt;
    QFileSystemEntry fsEntry(fileName);

    QString path = fsEntry.path();
    QString name = fsEntry.fileName();
    if (path == "."_L1 && !fileName.startsWith(path))
        path.clear();
    else
        path += u'/';

    QStringList suffixes;
    QStringList prefixes;
    if (pluginState != IsAPlugin) {
        prefixes << prefix_sys().toString();
        suffixes = suffixes_sys(fullVersion);
    }
    int dlFlags = 0;
    auto loadHints = this->loadHints();
    if (loadHints & QLibrary::ResolveAllSymbolsHint) {
        dlFlags |= RTLD_NOW;
    } else {
        dlFlags |= RTLD_LAZY;
    }
    if (loadHints & QLibrary::ExportExternalSymbolsHint) {
        dlFlags |= RTLD_GLOBAL;
    }
#if !defined(Q_OS_CYGWIN)
    else {
        dlFlags |= RTLD_LOCAL;
    }
#endif
#if defined(RTLD_DEEPBIND)
    if (loadHints & QLibrary::DeepBindHint)
        dlFlags |= RTLD_DEEPBIND;
#endif

    // Provide access to RTLD_NODELETE flag on Unix
    // From GNU documentation on RTLD_NODELETE:
    // Do not unload the library during dlclose(). Consequently, the
    // library's specific static variables are not reinitialized if the
    // library is reloaded with dlopen() at a later time.
#if defined(RTLD_NODELETE)
    if (loadHints & QLibrary::PreventUnloadHint) {
#   ifdef Q_OS_ANDROID // RTLD_NODELETE flag is supported by Android 23+
        if (QtAndroidPrivate::androidSdkVersion() > 22)
#   endif
            dlFlags |= RTLD_NODELETE;
    }
#endif

#if defined(Q_OS_AIX)   // Not sure if any other platform actually support this thing.
    if (loadHints & QLibrary::LoadArchiveMemberHint) {
        dlFlags |= RTLD_MEMBER;
    }
#endif

    // If the filename is an absolute path then we want to try that first as it is most likely
    // what the callee wants. If we have been given a non-absolute path then lets try the
    // native library name first to avoid unnecessary calls to dlopen().
    if (fsEntry.isAbsolute()) {
        suffixes.prepend(QString());
        prefixes.prepend(QString());
    } else {
        suffixes.append(QString());
        prefixes.append(QString());
    }

#if defined(Q_PROCESSOR_X86) && !defined(Q_OS_DARWIN)
    if (qCpuHasFeature(ArchHaswell)) {
        auto transform = [](QStringList &list, void (*f)(QString *)) {
            QStringList tmp;
            qSwap(tmp, list);
            list.reserve(tmp.size() * 2);
            for (const QString &s : std::as_const(tmp)) {
                QString modifiedPath = s;
                f(&modifiedPath);
                list.append(modifiedPath);
                list.append(s);
            }
        };
        if (pluginState == IsAPlugin) {
            // add ".avx2" to each suffix in the list
            transform(suffixes, [](QString *s) { s->append(".avx2"_L1); });
        } else {
#  ifdef __GLIBC__
            // prepend "glibc-hwcaps/x86-64-v3/" to each prefix in the list
            transform(prefixes, [](QString *s) { s->prepend("glibc-hwcaps/x86-64-v3/"_L1); });
#  endif
        }
    }
#endif

    locker.unlock();
    bool retry = true;
    Handle hnd = nullptr;
    for (int prefix = 0; retry && !hnd && prefix < prefixes.size(); prefix++) {
        for (int suffix = 0; retry && !hnd && suffix < suffixes.size(); suffix++) {
            if (path.isEmpty() && prefixes.at(prefix).contains(u'/'))
                continue;
            if (!suffixes.at(suffix).isEmpty() && name.endsWith(suffixes.at(suffix)))
                continue;
            if (loadHints & QLibrary::LoadArchiveMemberHint) {
                attempt = name;
                qsizetype lparen = attempt.indexOf(u'(');
                if (lparen == -1)
                    lparen = attempt.size();
                attempt = path + prefixes.at(prefix) + attempt.insert(lparen, suffixes.at(suffix));
            } else {
                attempt = path + prefixes.at(prefix) + name + suffixes.at(suffix);
            }

            hnd = dlopen(QFile::encodeName(attempt), dlFlags);
#ifdef Q_OS_ANDROID
            if (!hnd) {
                auto attemptFromBundle = attempt;
                hnd = dlopen(QFile::encodeName(attemptFromBundle.replace(u'/', u'_')), dlFlags);
            }
#endif

            if (!hnd && fileName.startsWith(u'/') && QFile::exists(attempt)) {
                // We only want to continue if dlopen failed due to that the shared library did not exist.
                // However, we are only able to apply this check for absolute filenames (since they are
                // not influenced by the content of LD_LIBRARY_PATH, /etc/ld.so.cache, DT_RPATH etc...)
                // This is all because dlerror is flawed and cannot tell us the reason why it failed.
                retry = false;
            }
        }
    }

#ifdef Q_OS_DARWIN
    if (!hnd) {
        QByteArray utf8Bundle = fileName.toUtf8();
        QCFType<CFURLRef> bundleUrl = CFURLCreateFromFileSystemRepresentation(NULL, reinterpret_cast<const UInt8*>(utf8Bundle.data()), utf8Bundle.length(), true);
        QCFType<CFBundleRef> bundle = CFBundleCreate(NULL, bundleUrl);
        if (bundle) {
            QCFType<CFURLRef> url = CFBundleCopyExecutableURL(bundle);
            char executableFile[FILENAME_MAX];
            CFURLGetFileSystemRepresentation(url, true, reinterpret_cast<UInt8*>(executableFile), FILENAME_MAX);
            attempt = QString::fromUtf8(executableFile);
            hnd = dlopen(QFile::encodeName(attempt), dlFlags);
        }
    }
#endif

    locker.relock();
    if (!hnd) {
        errorString = QLibrary::tr("Cannot load library %1: %2")
                .arg(fileName, QString::fromLocal8Bit(dlerror()));
    }
    if (hnd) {
        qualifiedFileName = attempt;
        errorString.clear();
    }
    pHnd.storeRelaxed(hnd);
    return (hnd != nullptr);
}